

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_float32_primitive_rounded
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_object_tuple_t *floatObject;
  float fVar2;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    fVar2 = *(float *)(uVar1 + 0x10);
  }
  else {
    fVar2 = (float)(uVar1 >> 4);
  }
  fVar2 = roundf(fVar2);
  return (ulong)(uint)fVar2 << 4 | 0xd;
}

Assistant:

static sysbvm_tuple_t sysbvm_float32_primitive_rounded(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_float32_encode(context, (float)round(sysbvm_tuple_float32_decode(arguments[0])));
}